

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O0

bool __thiscall Satyricon::SATSolver::assume(SATSolver *this,Literal p)

{
  bool bVar1;
  literal_value lVar2;
  size_type sVar3;
  value_type_conflict1 local_1c;
  SATSolver *local_18;
  SATSolver *this_local;
  Literal p_local;
  
  local_18 = this;
  this_local._4_4_ = p.value;
  lVar2 = get_asigned_value(this,(Literal *)((long)&this_local + 4));
  if (lVar2 == LIT_UNASIGNED) {
    sVar3 = std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::size(&this->trail)
    ;
    local_1c = (value_type_conflict1)sVar3;
    std::vector<int,_std::allocator<int>_>::push_back(&this->trail_limit,&local_1c);
    bVar1 = assign(this,this_local._4_4_,(ClausePtr)0x0);
    return bVar1;
  }
  __assert_fail("get_asigned_value(p) == LIT_UNASIGNED",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/src/sat_solver.cpp"
                ,0xcf,"bool Satyricon::SATSolver::assume(Literal)");
}

Assistant:

bool SATSolver::assume( Literal p ) {
    assert( get_asigned_value(p) == LIT_UNASIGNED);
    trail_limit.push_back(static_cast<int>(trail.size()));
    return assign(p, nullptr);
}